

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_log>(Mat *a,Option *opt)

{
  ulong uVar1;
  ulong uVar2;
  long *in_RDI;
  float fVar3;
  ulong uVar4;
  float fVar6;
  float fVar7;
  undefined1 auVar5 [16];
  ulong uVar8;
  float fVar9;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log op;
  Mat *m;
  v4sf y;
  v4sf z;
  v4sf tmp;
  v4sf mask;
  v4sf e;
  v4sf invalid_mask;
  v4sf one;
  v4si emm0;
  ulong local_8a8;
  ulong uStack_8a0;
  int local_894;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined4 local_878;
  long local_870;
  undefined4 local_868;
  undefined4 local_864;
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined8 local_850;
  undefined1 (*local_848) [16];
  int local_840;
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  int local_82c;
  int local_828;
  undefined1 local_821 [9];
  long *local_818;
  undefined1 local_80d;
  int local_80c;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7e8;
  undefined1 (*local_7e0) [16];
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined1 (*local_7c8) [16];
  long local_7c0;
  undefined4 local_7b4;
  long local_7b0;
  undefined1 (*local_7a8) [16];
  undefined4 local_79c;
  int local_798;
  int local_794;
  undefined8 *local_790;
  undefined4 local_784;
  long local_780;
  undefined8 *local_770;
  ulong *local_748;
  undefined1 *local_740;
  undefined1 (*local_738) [16];
  undefined1 *local_730;
  undefined8 local_728;
  undefined8 uStack_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  ulong local_708;
  ulong uStack_700;
  int local_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  ulong local_698;
  ulong uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  ulong local_648;
  ulong uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  ulong local_608;
  ulong uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  ulong local_5a8;
  ulong uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  ulong local_588;
  ulong uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 *local_490;
  float *local_488;
  float *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  float local_458 [2];
  float afStack_450 [2];
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  float *local_428;
  float *local_420;
  float local_418 [2];
  float afStack_410 [2];
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 *local_3d0;
  float *local_3c8;
  float *local_3c0;
  float local_3b8 [2];
  float afStack_3b0 [2];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338 [2];
  float afStack_330 [2];
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8 [2];
  float afStack_2d0 [2];
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  float local_278 [2];
  float afStack_270 [2];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218 [2];
  float afStack_210 [2];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8 [2];
  float afStack_1b0 [2];
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158 [2];
  float afStack_150 [2];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8 [2];
  float afStack_f0 [2];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98 [2];
  float afStack_90 [2];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  ulong uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_828 = *(int *)((long)in_RDI + 0x2c);
  local_82c = (int)in_RDI[6];
  local_830 = *(int *)((long)in_RDI + 0x34);
  local_834 = (int)in_RDI[7];
  local_838 = (int)in_RDI[3];
  local_83c = local_828 * local_82c * local_830 * local_838;
  local_818 = in_RDI;
  for (local_840 = 0; local_840 < local_834; local_840 = local_840 + 1) {
    local_800 = &local_890;
    local_794 = *(int *)((long)local_818 + 0x2c);
    local_798 = (int)local_818[6];
    local_79c = *(undefined4 *)((long)local_818 + 0x34);
    local_7a8 = (undefined1 (*) [16])(*local_818 + local_818[8] * (long)local_840 * local_818[2]);
    local_7b0 = local_818[2];
    local_7b4 = (undefined4)local_818[3];
    local_7c0 = local_818[4];
    local_790 = &local_890;
    local_780 = (long)local_794 * (long)local_798 * local_7b0;
    local_7f8 = &local_890;
    local_7e8 = &local_890;
    local_784 = 0x10;
    local_80c = local_840;
    local_80d = 1;
    local_890 = 0;
    local_880 = 0;
    local_878 = 0;
    local_868 = 0;
    local_864 = 0;
    local_860 = 0;
    local_85c = 0;
    local_858 = 0;
    local_850 = 0;
    local_888 = 0;
    local_848 = local_7a8;
    for (local_894 = 0; local_770 = local_7e8, local_870 = local_7c0, local_894 + 3 < local_83c;
        local_894 = local_894 + 4) {
      local_7e0 = local_848;
      local_508 = *(undefined8 *)*local_848;
      uStack_500 = *(undefined8 *)(*local_848 + 8);
      local_740 = local_821;
      local_748 = &local_8a8;
      local_6c8 = 0x3f8000003f800000;
      uStack_6c0 = 0x3f8000003f800000;
      local_5f8 = 0;
      uStack_5f0 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68._0_4_ = (float)local_508;
      local_68._4_4_ = (float)((ulong)local_508 >> 0x20);
      uStack_60._0_4_ = (float)uStack_500;
      uStack_60._4_4_ = (float)((ulong)uStack_500 >> 0x20);
      local_6d8 = -(uint)((float)local_68 <= 0.0);
      iStack_6d4 = -(uint)(local_68._4_4_ <= 0.0);
      iStack_6d0 = -(uint)((float)uStack_60 <= 0.0);
      iStack_6cc = -(uint)(uStack_60._4_4_ <= 0.0);
      local_518 = 0x80000000800000;
      uStack_510 = 0x80000000800000;
      auVar5._8_8_ = 0x80000000800000;
      auVar5._0_8_ = 0x80000000800000;
      auVar5 = maxps(*local_848,auVar5);
      local_6a8 = auVar5._0_8_;
      local_38 = local_6a8;
      uStack_6a0 = auVar5._8_8_;
      uStack_30 = uStack_6a0;
      uVar1 = local_6a8;
      uVar2 = uStack_6a0;
      local_4c = 0x17;
      local_48._0_4_ = auVar5._0_4_;
      local_48._4_4_ = auVar5._4_4_;
      uStack_40._0_4_ = auVar5._8_4_;
      uStack_40._4_4_ = auVar5._12_4_;
      local_648 = local_6a8;
      uStack_640 = uStack_6a0;
      local_658 = 0x807fffff807fffff;
      uStack_650 = 0x807fffff807fffff;
      local_588 = local_6a8 & 0x807fffff807fffff;
      uStack_580 = uStack_6a0 & 0x807fffff807fffff;
      local_598 = 0x3f0000003f000000;
      uStack_590 = 0x3f0000003f000000;
      local_668 = local_588 | 0x3f0000003f000000;
      uStack_660 = uStack_580 | 0x3f0000003f000000;
      local_18 = CONCAT44(local_48._4_4_ >> 0x17,(uint)local_48 >> 0x17);
      uStack_10 = CONCAT44(uStack_40._4_4_ >> 0x17,(uint)uStack_40 >> 0x17);
      local_28 = 0x7f0000007f;
      uStack_20 = 0x7f0000007f;
      local_6b8 = ((uint)local_48 >> 0x17) - 0x7f;
      iStack_6b4 = (local_48._4_4_ >> 0x17) - 0x7f;
      iStack_6b0 = ((uint)uStack_40 >> 0x17) - 0x7f;
      iStack_6ac = (uStack_40._4_4_ >> 0x17) - 0x7f;
      local_5c8 = CONCAT44(iStack_6b4,local_6b8);
      uStack_5c0 = CONCAT44(iStack_6ac,iStack_6b0);
      local_4a8 = CONCAT44((float)iStack_6b4,(float)local_6b8);
      uStack_4a0 = CONCAT44((float)iStack_6ac,(float)iStack_6b0);
      local_4b8 = 0x3f8000003f800000;
      uStack_4b0 = 0x3f8000003f800000;
      local_6e8 = (float)local_6b8 + 1.0;
      fStack_6e4 = (float)iStack_6b4 + 1.0;
      fStack_6e0 = (float)iStack_6b0 + 1.0;
      fStack_6dc = (float)iStack_6ac + 1.0;
      local_5e8 = 0x3f3504f33f3504f3;
      uStack_5e0 = 0x3f3504f33f3504f3;
      local_5d8._0_4_ = (float)local_668;
      local_5d8._4_4_ = (float)(local_668 >> 0x20);
      uStack_5d0._0_4_ = (float)uStack_660;
      uStack_5d0._4_4_ = (float)(uStack_660 >> 0x20);
      local_6f8 = -(uint)((float)local_5d8 < 0.70710677);
      iStack_6f4 = -(uint)(local_5d8._4_4_ < 0.70710677);
      iStack_6f0 = -(uint)((float)uStack_5d0 < 0.70710677);
      iStack_6ec = -(uint)(uStack_5d0._4_4_ < 0.70710677);
      local_678 = CONCAT44(iStack_6f4,local_6f8);
      uStack_670 = CONCAT44(iStack_6ec,iStack_6f0);
      local_708 = local_668 & local_678;
      uStack_700 = uStack_660 & uStack_670;
      local_618 = 0x3f8000003f800000;
      uStack_610 = 0x3f8000003f800000;
      local_6a8 = CONCAT44(local_5d8._4_4_ - 1.0,(float)local_5d8 - 1.0);
      uStack_6a0._0_4_ = (float)uStack_5d0 - 1.0;
      uStack_6a0._4_4_ = uStack_5d0._4_4_ - 1.0;
      local_628 = CONCAT44(fStack_6e4,local_6e8);
      uStack_620 = CONCAT44(fStack_6dc,fStack_6e0);
      local_688 = 0x3f8000003f800000;
      uStack_680 = 0x3f8000003f800000;
      local_698 = CONCAT44(iStack_6f4,local_6f8);
      uStack_690 = CONCAT44(iStack_6ec,iStack_6f0);
      uVar4 = local_698 & 0x3f8000003f800000;
      uVar8 = uStack_690 & 0x3f8000003f800000;
      local_638._0_4_ = (float)uVar4;
      local_638._4_4_ = (float)(uVar4 >> 0x20);
      uStack_630._0_4_ = (float)uVar8;
      uStack_630._4_4_ = (float)(uVar8 >> 0x20);
      local_6e8 = local_6e8 - (float)local_638;
      fStack_6e4 = fStack_6e4 - local_638._4_4_;
      fStack_6e0 = fStack_6e0 - (float)uStack_630;
      fStack_6dc = fStack_6dc - uStack_630._4_4_;
      local_4c8 = local_6a8;
      uStack_4c0 = uStack_6a0;
      local_4d8._0_4_ = (float)local_708;
      local_4d8._4_4_ = (float)(local_708 >> 0x20);
      uStack_4d0._0_4_ = (float)uStack_700;
      uStack_4d0._4_4_ = (float)(uStack_700 >> 0x20);
      local_4d8._0_4_ = ((float)local_5d8 - 1.0) + (float)local_4d8;
      local_4d8._4_4_ = (local_5d8._4_4_ - 1.0) + local_4d8._4_4_;
      uStack_4d0._0_4_ = ((float)uStack_5d0 - 1.0) + (float)uStack_4d0;
      uStack_4d0._4_4_ = (uStack_5d0._4_4_ - 1.0) + uStack_4d0._4_4_;
      local_6a8 = CONCAT44(local_4d8._4_4_,(float)local_4d8);
      uStack_6a0._0_4_ = (float)uStack_4d0;
      uStack_6a0._4_4_ = uStack_4d0._4_4_;
      local_538 = local_6a8;
      uStack_530 = uStack_6a0;
      local_718 = (float)local_4d8 * (float)local_4d8;
      fStack_714 = local_4d8._4_4_ * local_4d8._4_4_;
      fStack_710 = (float)uStack_4d0 * (float)uStack_4d0;
      fStack_70c = uStack_4d0._4_4_ * uStack_4d0._4_4_;
      local_c0 = &local_728;
      local_c8 = &local_6a8;
      local_d0 = ::_ps_cephes_log_p1;
      local_a8 = 0x3d9021bb3d9021bb;
      uStack_a0 = 0x3d9021bb3d9021bb;
      local_b8 = local_6a8;
      uStack_b0 = uStack_6a0;
      local_88 = (float)local_4d8 * 0.070376836;
      fStack_84 = local_4d8._4_4_ * 0.070376836;
      fStack_80 = (float)uStack_4d0 * 0.070376836;
      fStack_7c = uStack_4d0._4_4_ * 0.070376836;
      local_98[0] = -0.1151461;
      local_98[1] = -0.1151461;
      afStack_90[0] = -0.1151461;
      afStack_90[1] = -0.1151461;
      local_728 = CONCAT44(fStack_84 + -0.1151461,local_88 + -0.1151461);
      uStack_720 = CONCAT44(fStack_7c + -0.1151461,fStack_80 + -0.1151461);
      local_120 = &local_728;
      local_128 = &local_6a8;
      local_130 = ::_ps_cephes_log_p2;
      local_108 = local_728;
      uStack_100 = uStack_720;
      local_118 = local_6a8;
      uStack_110 = uStack_6a0;
      local_e8 = (local_88 + -0.1151461) * (float)local_4d8;
      fStack_e4 = (fStack_84 + -0.1151461) * local_4d8._4_4_;
      fStack_e0 = (fStack_80 + -0.1151461) * (float)uStack_4d0;
      fStack_dc = (fStack_7c + -0.1151461) * uStack_4d0._4_4_;
      local_f8[0] = 0.116769984;
      local_f8[1] = 0.116769984;
      afStack_f0[0] = 0.116769984;
      afStack_f0[1] = 0.116769984;
      local_728 = CONCAT44(fStack_e4 + 0.116769984,local_e8 + 0.116769984);
      uStack_720 = CONCAT44(fStack_dc + 0.116769984,fStack_e0 + 0.116769984);
      local_180 = &local_728;
      local_188 = &local_6a8;
      local_190 = ::_ps_cephes_log_p3;
      local_168 = local_728;
      uStack_160 = uStack_720;
      local_178 = local_6a8;
      uStack_170 = uStack_6a0;
      local_148 = (local_e8 + 0.116769984) * (float)local_4d8;
      fStack_144 = (fStack_e4 + 0.116769984) * local_4d8._4_4_;
      fStack_140 = (fStack_e0 + 0.116769984) * (float)uStack_4d0;
      fStack_13c = (fStack_dc + 0.116769984) * uStack_4d0._4_4_;
      local_158[0] = -0.12420141;
      local_158[1] = -0.12420141;
      afStack_150[0] = -0.12420141;
      afStack_150[1] = -0.12420141;
      local_728 = CONCAT44(fStack_144 + -0.12420141,local_148 + -0.12420141);
      uStack_720 = CONCAT44(fStack_13c + -0.12420141,fStack_140 + -0.12420141);
      local_1e0 = &local_728;
      local_1e8 = &local_6a8;
      local_1f0 = ::_ps_cephes_log_p4;
      local_1c8 = local_728;
      uStack_1c0 = uStack_720;
      local_1d8 = local_6a8;
      uStack_1d0 = uStack_6a0;
      local_1a8 = (local_148 + -0.12420141) * (float)local_4d8;
      fStack_1a4 = (fStack_144 + -0.12420141) * local_4d8._4_4_;
      fStack_1a0 = (fStack_140 + -0.12420141) * (float)uStack_4d0;
      fStack_19c = (fStack_13c + -0.12420141) * uStack_4d0._4_4_;
      local_1b8[0] = 0.14249323;
      local_1b8[1] = 0.14249323;
      afStack_1b0[0] = 0.14249323;
      afStack_1b0[1] = 0.14249323;
      local_728 = CONCAT44(fStack_1a4 + 0.14249323,local_1a8 + 0.14249323);
      uStack_720 = CONCAT44(fStack_19c + 0.14249323,fStack_1a0 + 0.14249323);
      local_240 = &local_728;
      local_248 = &local_6a8;
      local_250 = ::_ps_cephes_log_p5;
      local_228 = local_728;
      uStack_220 = uStack_720;
      local_238 = local_6a8;
      uStack_230 = uStack_6a0;
      local_208 = (local_1a8 + 0.14249323) * (float)local_4d8;
      fStack_204 = (fStack_1a4 + 0.14249323) * local_4d8._4_4_;
      fStack_200 = (fStack_1a0 + 0.14249323) * (float)uStack_4d0;
      fStack_1fc = (fStack_19c + 0.14249323) * uStack_4d0._4_4_;
      local_218[0] = -0.16668057;
      local_218[1] = -0.16668057;
      afStack_210[0] = -0.16668057;
      afStack_210[1] = -0.16668057;
      local_728 = CONCAT44(fStack_204 + -0.16668057,local_208 + -0.16668057);
      uStack_720 = CONCAT44(fStack_1fc + -0.16668057,fStack_200 + -0.16668057);
      local_2a0 = &local_728;
      local_2a8 = &local_6a8;
      local_2b0 = ::_ps_cephes_log_p6;
      local_288 = local_728;
      uStack_280 = uStack_720;
      local_298 = local_6a8;
      uStack_290 = uStack_6a0;
      local_268 = (local_208 + -0.16668057) * (float)local_4d8;
      fStack_264 = (fStack_204 + -0.16668057) * local_4d8._4_4_;
      fStack_260 = (fStack_200 + -0.16668057) * (float)uStack_4d0;
      fStack_25c = (fStack_1fc + -0.16668057) * uStack_4d0._4_4_;
      local_278[0] = 0.20000714;
      local_278[1] = 0.20000714;
      afStack_270[0] = 0.20000714;
      afStack_270[1] = 0.20000714;
      local_728 = CONCAT44(fStack_264 + 0.20000714,local_268 + 0.20000714);
      uStack_720 = CONCAT44(fStack_25c + 0.20000714,fStack_260 + 0.20000714);
      local_300 = &local_728;
      local_308 = &local_6a8;
      local_310 = ::_ps_cephes_log_p7;
      local_2e8 = local_728;
      uStack_2e0 = uStack_720;
      local_2f8 = local_6a8;
      uStack_2f0 = uStack_6a0;
      local_2c8 = (local_268 + 0.20000714) * (float)local_4d8;
      fStack_2c4 = (fStack_264 + 0.20000714) * local_4d8._4_4_;
      fStack_2c0 = (fStack_260 + 0.20000714) * (float)uStack_4d0;
      fStack_2bc = (fStack_25c + 0.20000714) * uStack_4d0._4_4_;
      local_2d8[0] = -0.24999994;
      local_2d8[1] = -0.24999994;
      afStack_2d0[0] = -0.24999994;
      afStack_2d0[1] = -0.24999994;
      local_728 = CONCAT44(fStack_2c4 + -0.24999994,local_2c8 + -0.24999994);
      uStack_720 = CONCAT44(fStack_2bc + -0.24999994,fStack_2c0 + -0.24999994);
      local_360 = &local_728;
      local_368 = &local_6a8;
      local_370 = ::_ps_cephes_log_p8;
      local_348 = local_728;
      uStack_340 = uStack_720;
      local_358 = local_6a8;
      uStack_350 = uStack_6a0;
      local_328 = (local_2c8 + -0.24999994) * (float)local_4d8;
      fStack_324 = (fStack_2c4 + -0.24999994) * local_4d8._4_4_;
      fStack_320 = (fStack_2c0 + -0.24999994) * (float)uStack_4d0;
      fStack_31c = (fStack_2bc + -0.24999994) * uStack_4d0._4_4_;
      local_338[0] = 0.3333333;
      local_338[1] = 0.3333333;
      afStack_330[0] = 0.3333333;
      afStack_330[1] = 0.3333333;
      local_728 = CONCAT44(fStack_324 + 0.3333333,local_328 + 0.3333333);
      uStack_720 = CONCAT44(fStack_31c + 0.3333333,fStack_320 + 0.3333333);
      local_548 = local_728;
      uStack_540 = uStack_720;
      local_558 = local_6a8;
      uStack_550 = uStack_6a0;
      fVar3 = (local_328 + 0.3333333) * (float)local_4d8;
      fVar6 = (fStack_324 + 0.3333333) * local_4d8._4_4_;
      fVar7 = (fStack_320 + 0.3333333) * (float)uStack_4d0;
      fVar9 = (fStack_31c + 0.3333333) * uStack_4d0._4_4_;
      local_728 = CONCAT44(fVar6,fVar3);
      uStack_720 = CONCAT44(fVar9,fVar7);
      local_568 = local_728;
      uStack_560 = uStack_720;
      local_578 = CONCAT44(fStack_714,local_718);
      uStack_570 = CONCAT44(fStack_70c,fStack_710);
      fVar3 = fVar3 * local_718;
      fVar6 = fVar6 * fStack_714;
      fVar7 = fVar7 * fStack_710;
      fVar9 = fVar9 * fStack_70c;
      local_728 = CONCAT44(fVar6,fVar3);
      uStack_720 = CONCAT44(fVar9,fVar7);
      local_3c0 = &local_6e8;
      local_3c8 = ::_ps_cephes_log_q1;
      local_3d0 = &local_728;
      local_3a8 = CONCAT44(fStack_6e4,local_6e8);
      uStack_3a0 = CONCAT44(fStack_6dc,fStack_6e0);
      local_3b8[0] = -0.00021219444;
      local_3b8[1] = -0.00021219444;
      afStack_3b0[0] = -0.00021219444;
      afStack_3b0[1] = -0.00021219444;
      local_388 = local_6e8 * -0.00021219444;
      fStack_384 = fStack_6e4 * -0.00021219444;
      fStack_380 = fStack_6e0 * -0.00021219444;
      fStack_37c = fStack_6dc * -0.00021219444;
      local_398 = local_728;
      uStack_390 = uStack_720;
      fVar3 = local_388 + fVar3;
      fVar6 = fStack_384 + fVar6;
      fVar7 = fStack_380 + fVar7;
      fVar9 = fStack_37c + fVar9;
      local_728 = CONCAT44(fVar6,fVar3);
      uStack_720 = CONCAT44(fVar9,fVar7);
      local_480 = &local_718;
      local_488 = ::_ps_0p5;
      local_490 = &local_728;
      local_468 = local_728;
      uStack_460 = uStack_720;
      local_448 = CONCAT44(fStack_714,local_718);
      uStack_440 = CONCAT44(fStack_70c,fStack_710);
      local_458[0] = 0.5;
      local_458[1] = 0.5;
      afStack_450[0] = 0.5;
      afStack_450[1] = 0.5;
      local_478 = local_718 * 0.5;
      fStack_474 = fStack_714 * 0.5;
      fStack_470 = fStack_710 * 0.5;
      fStack_46c = fStack_70c * 0.5;
      fVar3 = fVar3 - local_478;
      fVar6 = fVar6 - fStack_474;
      fVar7 = fVar7 - fStack_470;
      fVar9 = fVar9 - fStack_46c;
      local_728 = CONCAT44(fVar6,fVar3);
      uStack_720 = CONCAT44(fVar9,fVar7);
      local_4e8 = local_6a8;
      uStack_4e0 = uStack_6a0;
      local_4f8 = local_728;
      uStack_4f0 = uStack_720;
      local_4d8._0_4_ = (float)local_4d8 + fVar3;
      local_4d8._4_4_ = local_4d8._4_4_ + fVar6;
      uStack_4d0._0_4_ = (float)uStack_4d0 + fVar7;
      uStack_4d0._4_4_ = uStack_4d0._4_4_ + fVar9;
      local_6a8 = CONCAT44(local_4d8._4_4_,(float)local_4d8);
      uStack_6a0._0_4_ = (float)uStack_4d0;
      uStack_6a0._4_4_ = uStack_4d0._4_4_;
      local_420 = &local_6e8;
      local_428 = ::_ps_cephes_log_q2;
      local_430 = &local_6a8;
      local_408 = CONCAT44(fStack_6e4,local_6e8);
      uStack_400 = CONCAT44(fStack_6dc,fStack_6e0);
      local_418[0] = 0.6933594;
      local_418[1] = 0.6933594;
      afStack_410[0] = 0.6933594;
      afStack_410[1] = 0.6933594;
      local_3e8 = local_6e8 * 0.6933594;
      fStack_3e4 = fStack_6e4 * 0.6933594;
      fStack_3e0 = fStack_6e0 * 0.6933594;
      fStack_3dc = fStack_6dc * 0.6933594;
      local_3f8 = local_6a8;
      uStack_3f0 = uStack_6a0;
      local_6a8 = CONCAT44(fStack_3e4 + local_4d8._4_4_,local_3e8 + (float)local_4d8);
      uStack_6a0._0_4_ = fStack_3e0 + (float)uStack_4d0;
      uStack_6a0._4_4_ = fStack_3dc + uStack_4d0._4_4_;
      local_5a8 = local_6a8;
      uStack_5a0 = uStack_6a0;
      local_5b8 = CONCAT44(iStack_6d4,local_6d8);
      uStack_5b0 = CONCAT44(iStack_6cc,iStack_6d0);
      local_8a8 = local_6a8 | local_5b8;
      uStack_8a0 = uStack_6a0 | uStack_5b0;
      uStack_6a0 = uStack_8a0;
      local_6a8 = local_8a8;
      local_7c8 = local_848;
      local_7d8._0_4_ = (undefined4)local_8a8;
      local_7d8._4_4_ = (undefined4)(local_8a8 >> 0x20);
      uStack_7d0._0_4_ = (undefined4)uStack_8a0;
      uStack_7d0._4_4_ = (undefined4)(uStack_8a0 >> 0x20);
      *(undefined4 *)*local_848 = (undefined4)local_7d8;
      *(undefined4 *)(*local_848 + 4) = local_7d8._4_4_;
      *(undefined4 *)(*local_848 + 8) = (undefined4)uStack_7d0;
      *(undefined4 *)(*local_848 + 0xc) = uStack_7d0._4_4_;
      local_848 = local_848 + 1;
      local_7d8 = local_8a8;
      uStack_7d0 = uStack_8a0;
      local_638 = uVar4;
      uStack_630 = uVar8;
      local_608 = local_668;
      uStack_600 = uStack_660;
      local_5d8 = local_668;
      uStack_5d0 = uStack_660;
      local_528 = local_538;
      uStack_520 = uStack_530;
      local_4d8 = local_708;
      uStack_4d0 = uStack_700;
      local_68 = local_508;
      uStack_60 = uStack_500;
      local_48 = uVar1;
      uStack_40 = uVar2;
    }
    for (; local_894 < local_83c; local_894 = local_894 + 1) {
      local_730 = local_821;
      local_738 = local_848;
      fVar3 = logf(*(float *)*local_848);
      *(float *)*local_848 = fVar3;
      local_848 = (undefined1 (*) [16])(*local_848 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}